

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xml_parse_result * __thiscall
pugi::xml_document::load
          (xml_parse_result *__return_storage_ptr__,xml_document *this,
          basic_istream<wchar_t,_std::char_traits<wchar_t>_> *stream,uint options)

{
  xml_document_struct *doc;
  undefined *puVar1;
  long lVar2;
  long lVar3;
  void *pvVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  ulong uVar8;
  undefined8 *puVar9;
  void *pvVar10;
  xml_parse_status xVar11;
  xml_document *pxVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  size_t local_60;
  void *local_58;
  
  _destroy(this);
  _create(this);
  if (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 5) != 0) {
    __return_storage_ptr__->offset = 0;
    __return_storage_ptr__->encoding = encoding_auto;
    __return_storage_ptr__->status = status_io_error;
    return __return_storage_ptr__;
  }
  doc = (xml_document_struct *)(this->super_xml_node)._root;
  lVar2 = std::wistream::tellg();
  if (lVar2 < 0) {
    local_58 = (void *)0x0;
    std::wios::clear((int)*(undefined8 *)(*(long *)stream + -0x18) + (int)stream);
    local_60 = 0;
    puVar6 = (undefined8 *)0x0;
    puVar9 = (undefined8 *)0x0;
    pxVar12 = this;
    do {
      if (((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 2) != 0) {
        local_58 = (void *)(*(code *)impl::(anonymous_namespace)::
                                     xml_memory_management_function_storage<int>::allocate)
                                     (local_60 + 1);
        if (local_58 == (void *)0x0) {
          pxVar12 = (xml_document *)0x3;
          local_60 = 0;
          local_58 = (void *)0x0;
        }
        else {
          pvVar4 = local_58;
          if (puVar9 != (undefined8 *)0x0) {
            puVar6 = puVar9;
            do {
              if ((long)local_58 + local_60 < (ulong)((long)pvVar4 + puVar6[1])) {
                __assert_fail("write + chunk->size <= buffer + total",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/JeffIrwin[P]maph/submodules/colormapper/submodules/pugixml/src/pugixml.cpp"
                              ,0x1329,
                              "xml_parse_status pugi::impl::(anonymous namespace)::load_stream_data_noseek(std::basic_istream<T> &, void **, size_t *) [T = wchar_t]"
                             );
              }
              memcpy(pvVar4,puVar6 + 2,puVar6[1]);
              pvVar4 = (void *)((long)pvVar4 + puVar6[1]);
              puVar6 = (undefined8 *)*puVar6;
            } while (puVar6 != (undefined8 *)0x0);
          }
          pxVar12 = (xml_document *)0x0;
          if (pvVar4 != (void *)((long)local_58 + local_60)) {
            __assert_fail("write == buffer + total",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/JeffIrwin[P]maph/submodules/colormapper/submodules/pugixml/src/pugixml.cpp"
                          ,0x132e,
                          "xml_parse_status pugi::impl::(anonymous namespace)::load_stream_data_noseek(std::basic_istream<T> &, void **, size_t *) [T = wchar_t]"
                         );
          }
        }
        goto LAB_0012940b;
      }
      puVar5 = (undefined8 *)
               (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::
                         allocate)(0x7fe8);
      if (puVar5 == (undefined8 *)0x0) {
        puVar5 = (undefined8 *)0x0;
      }
      else {
        *puVar5 = 0;
        puVar5[1] = 0;
      }
      if (puVar5 == (undefined8 *)0x0) {
        pxVar12 = (xml_document *)0x3;
        bVar13 = false;
        puVar5 = puVar6;
        puVar7 = puVar9;
      }
      else {
        puVar7 = puVar5;
        if (puVar6 != (undefined8 *)0x0) {
          *puVar6 = puVar5;
          puVar7 = puVar9;
        }
        std::wistream::read((wchar_t *)stream,(long)(puVar5 + 2));
        lVar2 = *(long *)(stream + 8);
        puVar5[1] = lVar2 * 4;
        if ((*(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) & 6) == 4 ||
            (*(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) & 1) != 0) {
          pxVar12 = (xml_document *)0x2;
          bVar13 = false;
        }
        else {
          uVar8 = lVar2 * 4 + local_60;
          bVar13 = local_60 <= uVar8;
          if (local_60 < uVar8) {
            local_60 = uVar8;
          }
          pxVar12 = (xml_document *)((ulong)pxVar12 & 0xffffffff);
          if (!bVar13) {
            pxVar12 = (xml_document *)0x3;
          }
        }
      }
      puVar6 = puVar5;
      puVar9 = puVar7;
    } while (bVar13);
    local_60 = 0;
LAB_0012940b:
    while (xVar11 = (xml_parse_status)pxVar12, puVar9 != (undefined8 *)0x0) {
      puVar6 = (undefined8 *)*puVar9;
      (*(code *)impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate
      )(puVar9);
      puVar9 = puVar6;
    }
    goto LAB_00129454;
  }
  auVar14 = std::wistream::tellg();
  lVar2 = auVar14._0_8_;
  local_60 = 0;
  xVar11 = status_io_error;
  std::wistream::seekg((long)stream,_S_beg);
  lVar3 = std::wistream::tellg();
  std::wistream::seekg(stream,lVar2,auVar14._8_8_);
  local_58 = (void *)0x0;
  if (lVar2 < 0 || ((byte)stream[*(long *)(*(long *)stream + -0x18) + 0x20] & 5) != 0)
  goto LAB_00129454;
  uVar8 = lVar3 - lVar2;
  if ((long)uVar8 < 0) {
    xVar11 = status_out_of_memory;
    local_60 = 0;
    local_58 = (void *)0x0;
    goto LAB_00129454;
  }
  pvVar4 = (void *)(*(code *)impl::(anonymous_namespace)::
                             xml_memory_management_function_storage<int>::allocate)(uVar8 * 4 + 1);
  puVar1 = impl::(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate;
  if (pvVar4 == (void *)0x0) {
    xVar11 = status_out_of_memory;
LAB_001293e6:
    local_60 = 0;
    local_58 = (void *)0x0;
    pvVar10 = pvVar4;
  }
  else {
    std::wistream::read((wchar_t *)stream,(long)pvVar4);
    if ((*(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) & 6) == 4 ||
        (*(uint *)(stream + *(long *)(*(long *)stream + -0x18) + 0x20) & 1) != 0) {
      xVar11 = status_io_error;
      goto LAB_001293e6;
    }
    if (uVar8 < *(ulong *)(stream + 8)) {
      __assert_fail("actual_length <= read_length",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JeffIrwin[P]maph/submodules/colormapper/submodules/pugixml/src/pugixml.cpp"
                    ,0x1353,
                    "xml_parse_status pugi::impl::(anonymous namespace)::load_stream_data_seek(std::basic_istream<T> &, void **, size_t *) [T = wchar_t]"
                   );
    }
    local_60 = *(ulong *)(stream + 8) << 2;
    xVar11 = status_ok;
    pvVar10 = (void *)0x0;
    local_58 = pvVar4;
  }
  if (pvVar10 != (void *)0x0) {
    (*(code *)puVar1)(pvVar10);
  }
LAB_00129454:
  if (xVar11 == status_ok) {
    impl::anon_unknown_0::load_buffer_impl
              (__return_storage_ptr__,doc,(xml_node_struct *)doc,local_58,local_60,options,
               encoding_utf32_le,true,true,&this->_buffer);
  }
  else {
    __return_storage_ptr__->offset = 0;
    __return_storage_ptr__->encoding = encoding_auto;
    __return_storage_ptr__->status = xVar11;
  }
  return __return_storage_ptr__;
}

Assistant:

PUGI__FN xml_parse_result xml_document::load(std::basic_istream<wchar_t, std::char_traits<wchar_t> >& stream, unsigned int options)
	{
		reset();

		return impl::load_stream_impl(static_cast<impl::xml_document_struct*>(_root), stream, options, encoding_wchar, &_buffer);
	}